

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_tape.cpp
# Opt level: O2

int TAP_SaveEmpty(path *fname)

{
  FILE *__stream;
  string local_30;
  
  __stream = (FILE *)SJ_fopen(fname,"wb");
  if (__stream == (FILE *)0x0) {
    std::filesystem::__cxx11::path::string(&local_30,fname);
    Error("opening file for write",local_30._M_dataplus._M_p,PASS3);
    std::__cxx11::string::~string((string *)&local_30);
  }
  else {
    fclose(__stream);
  }
  return (uint)(__stream != (FILE *)0x0);
}

Assistant:

int TAP_SaveEmpty(const std::filesystem::path & fname) {
	FILE* ff;
	if (!FOPEN_ISOK(ff, fname, "wb")) {
		Error("opening file for write", fname.string().c_str()); return 0;
	}
	fclose(ff);
	return 1;
}